

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_ecdsa_adaptor_sig_verify_helper
              (secp256k1_context *ctx,secp256k1_ge *result,secp256k1_scalar *sigr,
              secp256k1_scalar *sigs,secp256k1_ge *pubkey,secp256k1_scalar *message)

{
  int iVar1;
  int iVar2;
  secp256k1_scalar u2;
  secp256k1_scalar u1;
  secp256k1_scalar sn;
  secp256k1_gej pr;
  secp256k1_gej pubkeyj;
  
  iVar1 = secp256k1_scalar_is_zero(sigr);
  iVar2 = 0;
  if (iVar1 == 0) {
    iVar1 = secp256k1_scalar_is_zero(sigs);
    if (iVar1 == 0) {
      secp256k1_scalar_inverse(&sn,sigs);
      secp256k1_scalar_mul(&u1,&sn,message);
      secp256k1_scalar_mul(&u2,&sn,sigr);
      pubkeyj.infinity = pubkey->infinity;
      pubkeyj.x.n[0] = (pubkey->x).n[0];
      pubkeyj.x.n[1] = (pubkey->x).n[1];
      pubkeyj.x.n[2] = (pubkey->x).n[2];
      pubkeyj.x.n[3] = (pubkey->x).n[3];
      pubkeyj.x.n[4] = (pubkey->x).n[4];
      pubkeyj.y.n[0] = (pubkey->y).n[0];
      pubkeyj.y.n[1] = (pubkey->y).n[1];
      pubkeyj.y.n[2] = (pubkey->y).n[2];
      pubkeyj.y.n[3] = (pubkey->y).n[3];
      pubkeyj.y.n[4] = (pubkey->y).n[4];
      pubkeyj.z.n[0] = 1;
      pubkeyj.z.n[1] = 0;
      pubkeyj.z.n[2] = 0;
      pubkeyj.z.n[3] = 0;
      pubkeyj.z.n[4] = 0;
      secp256k1_ecmult(&ctx->ecmult_ctx,&pr,&pubkeyj,&u2,&u1);
      iVar2 = 0;
      if (pr.infinity == 0) {
        secp256k1_ge_set_gej(result,&pr);
        iVar2 = 1;
      }
    }
    else {
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

SECP256K1_API int secp256k1_ecdsa_adaptor_sig_verify_helper(const secp256k1_context* ctx, secp256k1_ge *result, secp256k1_scalar *sigr, secp256k1_scalar *sigs, const secp256k1_ge *pubkey, const secp256k1_scalar *message) {
    secp256k1_scalar sn, u1, u2;
    secp256k1_gej pubkeyj;
    secp256k1_gej pr;

    if (secp256k1_scalar_is_zero(sigr) || secp256k1_scalar_is_zero(sigs)) {
        return 0;
    }

    secp256k1_scalar_inverse_var(&sn, sigs);
    secp256k1_scalar_mul(&u1, &sn, message);
    secp256k1_scalar_mul(&u2, &sn, sigr);

    secp256k1_gej_set_ge(&pubkeyj, pubkey);
    secp256k1_ecmult(&ctx->ecmult_ctx, &pr, &pubkeyj, &u2, &u1);
    if (secp256k1_gej_is_infinity(&pr)) {
        return 0;
    }
    secp256k1_ge_set_gej(result, &pr);
    return 1;
}